

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skeleton.cxx
# Opt level: O2

void __thiscall xray_re::s_joint_ik_data::reset(s_joint_ik_data *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->type = 0;
  for (lVar2 = 0x24; lVar2 != -0xc; lVar2 = lVar2 + -0x10) {
    puVar1 = (undefined8 *)((long)this->limits + lVar2 + -4);
    *puVar1 = 0;
    puVar1[1] = 0x3f8000003f800000;
  }
  this->spring_factor = 1.0;
  this->damping_factor = 1.0;
  this->ik_flags = 0;
  this->break_force = 0.0;
  this->break_torque = 0.0;
  this->friction = 1.0;
  return;
}

Assistant:

void s_joint_ik_data::reset()
{
	type = JT_RIGID;
	for (uint_fast32_t i = 3; i != 0;)
		limits[--i].reset();
	spring_factor = 1.f;
	damping_factor = 1.f;
	ik_flags = 0;
	break_force = 0;
	break_torque = 0;
	friction = 1.f;
}